

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O1

void __thiscall HighsNodeQueue::setNumCol(HighsNodeQueue *this,HighsInt numCol)

{
  undefined4 *puVar1;
  _Head_base<0UL,_HighsNodeQueue::AllocatorState_*,_false> _Var2;
  set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
  *psVar3;
  pointer __p;
  _Head_base<0UL,_HighsNodeQueue::AllocatorState_*,_false> _Var4;
  set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
  *psVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  AllocatorState *local_20;
  
  if (this->numCol != numCol) {
    this->numCol = numCol;
    _Var4._M_head_impl = (AllocatorState *)operator_new(0x20);
    (_Var4._M_head_impl)->freeListHead = (void *)0x0;
    (_Var4._M_head_impl)->currChunkStart = (char *)0x0;
    (_Var4._M_head_impl)->currChunkEnd = (char *)0x0;
    (_Var4._M_head_impl)->chunkListHead = (Chunk *)0x0;
    local_20 = (AllocatorState *)0x0;
    _Var2._M_head_impl =
         (this->allocatorState)._M_t.
         super___uniq_ptr_impl<HighsNodeQueue::AllocatorState,_std::default_delete<HighsNodeQueue::AllocatorState>_>
         ._M_t.
         super__Tuple_impl<0UL,_HighsNodeQueue::AllocatorState_*,_std::default_delete<HighsNodeQueue::AllocatorState>_>
         .super__Head_base<0UL,_HighsNodeQueue::AllocatorState_*,_false>._M_head_impl;
    (this->allocatorState)._M_t.
    super___uniq_ptr_impl<HighsNodeQueue::AllocatorState,_std::default_delete<HighsNodeQueue::AllocatorState>_>
    ._M_t.
    super__Tuple_impl<0UL,_HighsNodeQueue::AllocatorState_*,_std::default_delete<HighsNodeQueue::AllocatorState>_>
    .super__Head_base<0UL,_HighsNodeQueue::AllocatorState_*,_false>._M_head_impl =
         _Var4._M_head_impl;
    if (_Var2._M_head_impl != (AllocatorState *)0x0) {
      std::default_delete<HighsNodeQueue::AllocatorState>::operator()
                ((default_delete<HighsNodeQueue::AllocatorState> *)this,_Var2._M_head_impl);
    }
    if (local_20 != (AllocatorState *)0x0) {
      std::default_delete<HighsNodeQueue::AllocatorState>::operator()
                ((default_delete<HighsNodeQueue::AllocatorState> *)&local_20,local_20);
    }
    if (numCol != 0) {
      psVar5 = (set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
                *)operator_new((long)numCol * 0x38);
      psVar3 = (this->colLowerNodesPtr)._M_t.
               super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
               ._M_t.
               super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
               .
               super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
               ._M_head_impl;
      (this->colLowerNodesPtr)._M_t.
      super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
      ._M_t.
      super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
      .
      super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
      ._M_head_impl = psVar5;
      if (psVar3 != (set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
                     *)0x0) {
        operator_delete(psVar3);
      }
      psVar5 = (set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
                *)operator_new((long)numCol * 0x38);
      psVar3 = (this->colUpperNodesPtr)._M_t.
               super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
               ._M_t.
               super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
               .
               super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
               ._M_head_impl;
      (this->colUpperNodesPtr)._M_t.
      super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
      ._M_t.
      super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
      .
      super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
      ._M_head_impl = psVar5;
      if (psVar3 != (set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
                     *)0x0) {
        operator_delete(psVar3);
      }
      if (0 < numCol) {
        _Var2._M_head_impl =
             (this->allocatorState)._M_t.
             super___uniq_ptr_impl<HighsNodeQueue::AllocatorState,_std::default_delete<HighsNodeQueue::AllocatorState>_>
             ._M_t.
             super__Tuple_impl<0UL,_HighsNodeQueue::AllocatorState_*,_std::default_delete<HighsNodeQueue::AllocatorState>_>
             .super__Head_base<0UL,_HighsNodeQueue::AllocatorState_*,_false>._M_head_impl;
        lVar6 = 0;
        do {
          lVar7 = (long)&(((this->colLowerNodesPtr)._M_t.
                           super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                           .
                           super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                          ._M_head_impl)->_M_t)._M_impl + lVar6;
          lVar8 = lVar7 + 0x10;
          *(AllocatorState **)lVar7 = _Var2._M_head_impl;
          *(undefined4 *)lVar8 = 0;
          *(undefined8 *)(lVar7 + 0x18) = 0;
          *(long *)(lVar7 + 0x20) = lVar8;
          *(long *)(lVar7 + 0x28) = lVar8;
          *(undefined8 *)(lVar7 + 0x30) = 0;
          puVar1 = (undefined4 *)
                   ((long)&(((this->colUpperNodesPtr)._M_t.
                             super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                             .
                             super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                            ._M_head_impl)->_M_t)._M_impl + lVar6 + 0x10);
          *(AllocatorState **)(puVar1 + -4) = _Var2._M_head_impl;
          *puVar1 = 0;
          *(undefined8 *)(puVar1 + 2) = 0;
          *(undefined4 **)(puVar1 + 4) = puVar1;
          *(undefined4 **)(puVar1 + 6) = puVar1;
          *(undefined8 *)(puVar1 + 8) = 0;
          lVar6 = lVar6 + 0x38;
        } while ((ulong)(uint)numCol * 0x38 - lVar6 != 0);
      }
    }
  }
  return;
}

Assistant:

void HighsNodeQueue::setNumCol(HighsInt numCol) {
  if (this->numCol == numCol) return;
  this->numCol = numCol;
  allocatorState = std::unique_ptr<AllocatorState>(new AllocatorState());

  if (numCol == 0) return;
  colLowerNodesPtr =
      NodeSetArray((NodeSet*)::operator new(sizeof(NodeSet) * numCol));
  colUpperNodesPtr =
      NodeSetArray((NodeSet*)::operator new(sizeof(NodeSet) * numCol));

  NodesetAllocator<std::pair<double, int64_t>> allocator(allocatorState.get());
  for (HighsInt i = 0; i < numCol; ++i) {
    new (colLowerNodesPtr.get() + i) NodeSet(allocator);
    new (colUpperNodesPtr.get() + i) NodeSet(allocator);
  }
}